

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extradata.cpp
# Opt level: O1

int32_t __thiscall
icu_63::ExtraData::writeNoNoMapping
          (ExtraData *this,UChar32 c,Norm *norm,UnicodeString *dataString,
          Hashtable *previousMappings)

{
  short sVar1;
  UHashtable *hash;
  int32_t iVar2;
  int32_t iVar3;
  UnicodeString *pUVar4;
  IcuToolErrorCode errorCode;
  UnicodeString newMapping;
  IcuToolErrorCode local_78;
  UnicodeString local_60;
  
  local_60.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003bf258;
  local_60.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar2 = writeMapping(this,c,norm,&local_60);
  iVar3 = uhash_geti_63(previousMappings->hash,&local_60);
  if (iVar3 == 0) {
    sVar1 = (dataString->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (dataString->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (-1 < local_60.fUnion.fStackFields.fLengthAndFlags) {
      local_60.fUnion.fFields.fLength = (int)local_60.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    pUVar4 = &local_60;
    UnicodeString::doAppend(dataString,pUVar4,0,local_60.fUnion.fFields.fLength);
    local_78.super_ErrorCode.errorCode = U_ZERO_ERROR;
    local_78.super_ErrorCode._vptr_ErrorCode = (_func_int **)&PTR__IcuToolErrorCode_003aef48;
    local_78.location = "gennorm2/writeExtraData()/Hashtable.puti()";
    hash = previousMappings->hash;
    pUVar4 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar4);
    if (pUVar4 == (UnicodeString *)0x0) {
      pUVar4 = (UnicodeString *)0x0;
    }
    else {
      UnicodeString::UnicodeString(pUVar4,&local_60);
    }
    iVar3 = iVar3 + iVar2;
    uhash_puti_63(hash,pUVar4,iVar3 + 1,&local_78.super_ErrorCode.errorCode);
    IcuToolErrorCode::~IcuToolErrorCode(&local_78);
  }
  else {
    iVar3 = iVar3 + -1;
  }
  UnicodeString::~UnicodeString(&local_60);
  return iVar3;
}

Assistant:

int32_t ExtraData::writeNoNoMapping(UChar32 c, const Norm &norm,
                                    UnicodeString &dataString,
                                    Hashtable &previousMappings) {
    UnicodeString newMapping;
    int32_t offset=writeMapping(c, norm, newMapping);
    int32_t previousOffset=previousMappings.geti(newMapping);
    if(previousOffset!=0) {
        // Duplicate, point to the identical mapping that has already been stored.
        offset=previousOffset-1;
    } else {
        // Append this new mapping and
        // enter it into the hashtable, avoiding value 0 which is "not found".
        offset=dataString.length()+offset;
        dataString.append(newMapping);
        IcuToolErrorCode errorCode("gennorm2/writeExtraData()/Hashtable.puti()");
        previousMappings.puti(newMapping, offset+1, errorCode);
    }
    return offset;
}